

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NonMaximumSuppression::NonMaximumSuppression
          (NonMaximumSuppression *this,NonMaximumSuppression *from)

{
  InternalMetadata *this_00;
  double dVar1;
  NonMaximumSuppression_PickTop *this_01;
  StringVector *this_02;
  Int64Vector *this_03;
  undefined8 *puVar2;
  ulong uVar3;
  undefined1 *puVar4;
  Arena *pAVar5;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NonMaximumSuppression_004bb528;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar3 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (this_00,(string *)((uVar3 & 0xfffffffffffffffc) + 8));
  }
  (this->confidenceinputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar3 = (ulong)(from->confidenceinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    puVar2 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->confidenceinputfeaturename_,uVar3,puVar2)
    ;
  }
  (this->coordinatesinputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar3 = (ulong)(from->coordinatesinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    puVar2 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->coordinatesinputfeaturename_,uVar3,puVar2);
  }
  (this->iouthresholdinputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar3 = (ulong)(from->iouthresholdinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    puVar2 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->iouthresholdinputfeaturename_,uVar3,puVar2);
  }
  (this->confidencethresholdinputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar3 = (ulong)(from->confidencethresholdinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    puVar2 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->confidencethresholdinputfeaturename_,uVar3,puVar2);
  }
  (this->confidenceoutputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar3 = (ulong)(from->confidenceoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    puVar2 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->confidenceoutputfeaturename_,uVar3,puVar2);
  }
  (this->coordinatesoutputfeaturename_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar3 = (ulong)(from->coordinatesoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    puVar2 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->coordinatesoutputfeaturename_,uVar3,puVar2);
  }
  dVar1 = from->confidencethreshold_;
  this->iouthreshold_ = from->iouthreshold_;
  this->confidencethreshold_ = dVar1;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 1) {
    clear_SuppressionMethod(this);
    this->_oneof_case_[0] = 1;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar5 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar5 = *(Arena **)pAVar5;
    }
    this_01 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::NonMaximumSuppression_PickTop>(pAVar5);
    (this->SuppressionMethod_).picktop_ = this_01;
    if (from->_oneof_case_[0] == 1) {
      puVar4 = (undefined1 *)(from->SuppressionMethod_).picktop_;
    }
    else {
      puVar4 = _NonMaximumSuppression_PickTop_default_instance_;
    }
    NonMaximumSuppression_PickTop::MergeFrom(this_01,(NonMaximumSuppression_PickTop *)puVar4);
  }
  this->_oneof_case_[1] = 0;
  if (from->_oneof_case_[1] == 0x65) {
    clear_ClassLabels(this);
    this->_oneof_case_[1] = 0x65;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar5 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar5 = *(Arena **)pAVar5;
    }
    this_03 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                        (pAVar5);
    (this->ClassLabels_).int64classlabels_ = this_03;
    if (from->_oneof_case_[1] == 0x65) {
      puVar4 = (undefined1 *)(from->ClassLabels_).int64classlabels_;
    }
    else {
      puVar4 = _Int64Vector_default_instance_;
    }
    Int64Vector::MergeFrom(this_03,(Int64Vector *)puVar4);
  }
  else if (from->_oneof_case_[1] == 100) {
    clear_ClassLabels(this);
    this->_oneof_case_[1] = 100;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar5 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar5 = *(Arena **)pAVar5;
    }
    this_02 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                        (pAVar5);
    (this->ClassLabels_).stringclasslabels_ = this_02;
    if (from->_oneof_case_[1] == 100) {
      puVar4 = (undefined1 *)(from->ClassLabels_).stringclasslabels_;
    }
    else {
      puVar4 = _StringVector_default_instance_;
    }
    StringVector::MergeFrom(this_02,(StringVector *)puVar4);
  }
  return;
}

Assistant:

NonMaximumSuppression::NonMaximumSuppression(const NonMaximumSuppression& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  confidenceinputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    confidenceinputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_confidenceinputfeaturename().empty()) {
    confidenceinputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_confidenceinputfeaturename(), 
      GetArenaForAllocation());
  }
  coordinatesinputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    coordinatesinputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_coordinatesinputfeaturename().empty()) {
    coordinatesinputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_coordinatesinputfeaturename(), 
      GetArenaForAllocation());
  }
  iouthresholdinputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    iouthresholdinputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_iouthresholdinputfeaturename().empty()) {
    iouthresholdinputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_iouthresholdinputfeaturename(), 
      GetArenaForAllocation());
  }
  confidencethresholdinputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    confidencethresholdinputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_confidencethresholdinputfeaturename().empty()) {
    confidencethresholdinputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_confidencethresholdinputfeaturename(), 
      GetArenaForAllocation());
  }
  confidenceoutputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    confidenceoutputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_confidenceoutputfeaturename().empty()) {
    confidenceoutputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_confidenceoutputfeaturename(), 
      GetArenaForAllocation());
  }
  coordinatesoutputfeaturename_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    coordinatesoutputfeaturename_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_coordinatesoutputfeaturename().empty()) {
    coordinatesoutputfeaturename_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_coordinatesoutputfeaturename(), 
      GetArenaForAllocation());
  }
  ::memcpy(&iouthreshold_, &from.iouthreshold_,
    static_cast<size_t>(reinterpret_cast<char*>(&confidencethreshold_) -
    reinterpret_cast<char*>(&iouthreshold_)) + sizeof(confidencethreshold_));
  clear_has_SuppressionMethod();
  switch (from.SuppressionMethod_case()) {
    case kPickTop: {
      _internal_mutable_picktop()->::CoreML::Specification::NonMaximumSuppression_PickTop::MergeFrom(from._internal_picktop());
      break;
    }
    case SUPPRESSIONMETHOD_NOT_SET: {
      break;
    }
  }
  clear_has_ClassLabels();
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      _internal_mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      _internal_mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.NonMaximumSuppression)
}